

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  string *psVar1;
  ostream *poVar2;
  string *_name_local;
  ConsoleReporter *this_local;
  
  printOpenHeader(this,_name);
  poVar2 = (this->super_StreamingReporterBase).stream;
  psVar1 = getDots_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getDots() << "\n";
        }